

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stat.h
# Opt level: O2

ostream * operator<<(ostream *out,Stat<int> *stat)

{
  long lVar1;
  long lVar2;
  ostream *poVar3;
  float fVar4;
  
  lVar1 = *(long *)out;
  lVar2 = *(long *)(lVar1 + -0x18);
  *(uint *)(out + lVar2 + 0x18) = *(uint *)(out + lVar2 + 0x18) & 0xfffffefb | 4;
  *(undefined8 *)(out + *(long *)(lVar1 + -0x18) + 8) = 4;
  poVar3 = std::operator<<(out,0x20);
  *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 7;
  poVar3 = std::operator<<(out,"range: [");
  *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 7;
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,stat->minValue);
  poVar3 = std::operator<<(poVar3," ");
  std::ostream::operator<<(poVar3,stat->maxValue);
  poVar3 = std::operator<<(out,"], mean: ");
  fVar4 = 0.0;
  if (stat->cnt != 0) {
    fVar4 = (float)stat->sum / (float)stat->cnt;
  }
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,fVar4);
  poVar3 = std::operator<<(poVar3,", cnt: ");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(out,", sumOfSquares: ");
  fVar4 = 0.0;
  if (stat->cnt != 0) {
    fVar4 = (float)stat->sumOfSquares / (float)stat->cnt;
  }
  std::ostream::operator<<(poVar3,fVar4);
  poVar3 = std::operator<<(out,", ref: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,stat->ref);
  return poVar3;
}

Assistant:

std::ostream &operator<<( std::ostream &out, const Stat<M> &stat )
{
    int defPrecision = 4;
    int defWidth = defPrecision + 3;
    out << std::fixed << std::setprecision( defPrecision ) << std::setfill( ' ' ) << std::setw( defWidth );
    out << "range: [" << std::setw( defWidth ) << stat.GetMin() << " " << stat.GetMax();
    out << "], mean: " << stat.GetMean() << ", cnt: " << stat.GetCnt();
    out << ", sumOfSquares: " << stat.GetMeanSquare();
    return out << ", ref: " << stat.GetRef();
}